

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::prepend_attribute(xml_attribute_struct *attr,xml_node_struct *node)

{
  xml_attribute_struct *pxVar1;
  xml_attribute_struct *head;
  xml_node_struct *node_local;
  xml_attribute_struct *attr_local;
  
  pxVar1 = node->first_attribute;
  if (pxVar1 == (xml_attribute_struct *)0x0) {
    attr->prev_attribute_c = attr;
  }
  else {
    attr->prev_attribute_c = pxVar1->prev_attribute_c;
    pxVar1->prev_attribute_c = attr;
  }
  attr->next_attribute = pxVar1;
  node->first_attribute = attr;
  return;
}

Assistant:

inline void prepend_attribute(xml_attribute_struct* attr, xml_node_struct* node)
	{
		xml_attribute_struct* head = node->first_attribute;

		if (head)
		{
			attr->prev_attribute_c = head->prev_attribute_c;
			head->prev_attribute_c = attr;
		}
		else
			attr->prev_attribute_c = attr;

		attr->next_attribute = head;
		node->first_attribute = attr;
	}